

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Value * __thiscall cashew::Value::setArray(Value *this,size_t size_hint)

{
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this_00;
  
  free(this,(void *)size_hint);
  this->type = Array;
  this_00 = &GlobalMixedArena::alloc<cashew::ArrayStorage>((GlobalMixedArena *)arena)->
             super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>;
  (this->field_1).arr = (ArrayStorage *)this_00;
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::reserve(this_00,size_hint);
  return this;
}

Assistant:

Value& setArray(size_t size_hint = 0) {
    free();
    type = Array;
    arr = arena.alloc<ArrayStorage>();
    arr->reserve(size_hint);
    return *this;
  }